

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * google::protobuf::anon_unknown_1::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool lower_first)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  char *pcVar4;
  bool bVar5;
  char cVar6;
  size_type sVar7;
  bool bVar8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = input->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (input->_M_dataplus)._M_p;
    bVar8 = !lower_first;
    sVar7 = 0;
    do {
      bVar5 = true;
      if (pcVar3[sVar7] != '_') {
        if (bVar8) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar5 = false;
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar5 = bVar8;
        }
      }
      bVar8 = bVar5;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  if ((lower_first) && (__return_storage_ptr__->_M_string_length != 0)) {
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = *pcVar4;
    cVar6 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar6 = cVar1;
    }
    *pcVar4 = cVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToCamelCase(const std::string& input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = ToLower(result[0]);
  }

  return result;
}